

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::auto_managed(torrent *this,bool a)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  if ((bool)((byte)*(uint *)&this->field_0x600 & 1) != a) {
    uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    bVar4 = false;
    if ((((uVar2 & 0xe00000008000000) == 0x200000000000000) &&
        (uVar3 = (uint)uVar2, bVar4 = false, (uVar3 >> 0x1a & 1) == 0)) &&
       ((this->m_error).failed_ == false)) {
      bVar4 = (uVar3 >> 0x1c & 1) == 0;
    }
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xfffffffe | (uint)a;
    update_gauge(this);
    update_want_scrape(this);
    update_state_list(this);
    state_updated(this);
    bVar1 = (this->m_need_save_resume_data).m_val;
    if ((bVar1 & 0x20) == 0) {
      (this->m_need_save_resume_data).m_val = bVar1 | 0x20;
      state_updated(this);
    }
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
    if (((!bVar4) &&
        (uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48,
        (uVar2 & 0xe00000008000000) == 0x200000000000000)) &&
       (((uVar2 & 0x14000000) == 0 && ((this->m_error).failed_ == false)))) {
      start_checking(this);
      return;
    }
  }
  return;
}

Assistant:

void torrent::auto_managed(bool a)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_auto_managed == a) return;
		bool const checking_files = should_check_files();
		m_auto_managed = a;
		update_gauge();
		update_want_scrape();
		update_state_list();

		state_updated();

		// we need to save this new state as well
		set_need_save_resume(torrent_handle::if_config_changed);

		// recalculate which torrents should be
		// paused
		m_ses.trigger_auto_manage();

		if (!checking_files && should_check_files())
		{
			start_checking();
		}
	}